

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<kj::_::Void,_kj::String,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:522:11),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::_::Void,_kj::String,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:522:11),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::String> depResult;
  ExceptionOr<kj::String> local_5b8;
  ExceptionOr<kj::_::Void> local_438;
  Exception local_2d0;
  Exception local_178;
  
  local_5b8.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_5b8.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&local_5b8.super_ExceptionOrValue);
  if (local_5b8.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::Exception(&local_178,&local_5b8.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_2d0.ownFile.content.ptr = local_178.ownFile.content.ptr;
    local_2d0.ownFile.content.size_ = local_178.ownFile.content.size_;
    local_2d0.ownFile.content.disposer = local_178.ownFile.content.disposer;
    local_178.ownFile.content.ptr = (char *)0x0;
    local_178.ownFile.content.size_ = 0;
    local_2d0.file = local_178.file;
    local_2d0.line = local_178.line;
    local_2d0.type = local_178.type;
    local_2d0.description.content.ptr = local_178.description.content.ptr;
    local_2d0.description.content.size_ = local_178.description.content.size_;
    local_178.description.content.ptr = (char *)0x0;
    local_178.description.content.size_ = 0;
    local_2d0.description.content.disposer = local_178.description.content.disposer;
    local_2d0.context.ptr.disposer = local_178.context.ptr.disposer;
    local_2d0.context.ptr.ptr = local_178.context.ptr.ptr;
    local_178.context.ptr.ptr = (Context *)0x0;
    memcpy(local_2d0.trace,local_178.trace,0x104);
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_438,&local_2d0);
    local_438.value.ptr.isSet = false;
    Exception::~Exception(&local_2d0);
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_438);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_438);
    Exception::~Exception(&local_178);
  }
  else if (local_5b8.value.ptr.isSet == true) {
    local_2d0.ownFile.content.ptr = local_5b8.value.ptr.field_1.value.content.ptr;
    local_2d0.ownFile.content.size_ = local_5b8.value.ptr.field_1.value.content.size_;
    local_2d0.ownFile.content.disposer = local_5b8.value.ptr.field_1.value.content.disposer;
    local_5b8.value.ptr.field_1.value.content.ptr = (char *)0x0;
    local_5b8.value.ptr.field_1.value.content.size_ = 0;
    anon_class_8_1_a389c060_for_func::operator()(&this->func,&local_2d0.ownFile);
    Array<char>::~Array((Array<char> *)&local_2d0);
    local_438.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_438.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_438);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_438);
  }
  ExceptionOr<kj::String>::~ExceptionOr(&local_5b8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }